

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::Function::WhileEachInst
          (Function *this,function<bool_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  Instruction *pIVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  undefined3 in_register_00000009;
  undefined7 in_register_00000011;
  Instruction *dbg_line;
  Instruction *pIVar6;
  pointer puVar7;
  Instruction *pIVar8;
  Instruction *dbg_line_1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *non_semantic;
  pointer puVar9;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *param;
  Instruction *pIVar10;
  bool bVar11;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_58;
  undefined4 local_4c;
  Function *local_48;
  pointer local_40;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000009,run_on_non_semantic_insts);
  local_4c = (undefined4)CONCAT71(in_register_00000011,run_on_debug_line_insts);
  _Var1._M_head_impl =
       (this->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_48 = this;
  if (_Var1._M_head_impl == (Instruction *)0x0) {
LAB_0021aaf2:
    puVar9 = (local_48->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (local_48->params_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = puVar9 == local_40;
    while (!bVar11) {
      pIVar10 = (puVar9->_M_t).
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if ((char)local_4c != '\0') {
        pIVar8 = *(Instruction **)
                  &(pIVar10->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl;
        pIVar6 = *(pointer *)
                  ((long)&(pIVar10->dbg_line_insts_).
                          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  + 8);
        if (pIVar8 != pIVar6) {
          bVar4 = false;
          do {
            local_58._M_head_impl = pIVar8;
            if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
            bVar5 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
            if (!bVar5) {
              if (!bVar4) goto LAB_0021ab92;
              break;
            }
            pIVar8 = pIVar8 + 1;
            bVar4 = pIVar8 == pIVar6;
          } while (!bVar4);
        }
      }
      local_58._M_head_impl = pIVar10;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
      bVar4 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      if (!bVar4) {
LAB_0021ab92:
        if (!bVar11) goto LAB_0021adef;
        break;
      }
      puVar9 = puVar9 + 1;
      bVar11 = puVar9 == local_40;
    }
    pIVar10 = (local_48->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
              sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar10 != (Instruction *)0x0) &&
       ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      do {
        pIVar8 = pIVar10;
        if (pIVar8 == (Instruction *)0x0) goto LAB_0021ac5b;
        pIVar10 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar10 = (Instruction *)0x0;
        }
        if ((char)local_4c != '\0') {
          pIVar6 = (pIVar8->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pIVar2 = (pIVar8->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pIVar6 != pIVar2) {
            bVar11 = false;
            do {
              local_58._M_head_impl = pIVar6;
              if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
              bVar4 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
              if (!bVar4) {
                if (!bVar11) {
                  bVar11 = false;
                  goto LAB_0021ac40;
                }
                break;
              }
              pIVar6 = pIVar6 + 1;
              bVar11 = pIVar6 == pIVar2;
            } while (!bVar11);
          }
        }
        local_58._M_head_impl = pIVar8;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
        bVar11 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
LAB_0021ac40:
      } while (bVar11 != false);
      if (pIVar8 != (Instruction *)0x0) goto LAB_0021adef;
    }
LAB_0021ac5b:
    puVar7 = (local_48->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (local_48->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = puVar7 == puVar3;
    if (!bVar11) {
      bVar4 = (bool)(char)local_4c;
      bVar5 = BasicBlock::WhileEachInst
                        ((puVar7->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,f,
                         (bool)(char)local_4c);
      if (bVar5) {
        do {
          puVar7 = puVar7 + 1;
          bVar11 = puVar7 == puVar3;
          if (bVar11) goto LAB_0021acbb;
          bVar5 = BasicBlock::WhileEachInst
                            ((puVar7->_M_t).
                             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                             ,f,bVar4);
        } while (bVar5);
      }
      if (!bVar11) goto LAB_0021adef;
    }
LAB_0021acbb:
    pIVar10 = (local_48->end_inst_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar10 != (Instruction *)0x0) {
      if ((char)local_4c != '\0') {
        pIVar8 = (pIVar10->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar6 = *(pointer *)
                  ((long)&(pIVar10->dbg_line_insts_).
                          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  + 8);
        if (pIVar8 != pIVar6) {
          bVar11 = false;
          do {
            local_58._M_head_impl = pIVar8;
            if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
            bVar4 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
            if (!bVar4) {
              if (!bVar11) goto LAB_0021adef;
              break;
            }
            pIVar8 = pIVar8 + 1;
            bVar11 = pIVar8 == pIVar6;
          } while (!bVar11);
        }
      }
      local_58._M_head_impl = pIVar10;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0021ae00:
        std::__throw_bad_function_call();
      }
      bVar11 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      if (!bVar11) goto LAB_0021adef;
    }
    if ((char)local_34 != '\0') {
      puVar9 = (local_48->non_semantic_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_40 = (local_48->non_semantic_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      bVar11 = puVar9 == local_40;
      while (!bVar11) {
        pIVar10 = (puVar9->_M_t).
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if ((char)local_4c != '\0') {
          pIVar8 = (pIVar10->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pIVar6 = *(pointer *)
                    ((long)&(pIVar10->dbg_line_insts_).
                            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    + 8);
          if (pIVar8 != pIVar6) {
            bVar4 = false;
            do {
              local_58._M_head_impl = pIVar8;
              if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
              bVar5 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
              if (!bVar5) {
                if (!bVar4) goto LAB_0021ade4;
                break;
              }
              pIVar8 = pIVar8 + 1;
              bVar4 = pIVar8 == pIVar6;
            } while (!bVar4);
          }
        }
        local_58._M_head_impl = pIVar10;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
        bVar4 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
        if (!bVar4) {
LAB_0021ade4:
          if (!bVar11) goto LAB_0021adef;
          break;
        }
        puVar9 = puVar9 + 1;
        bVar11 = puVar9 == local_40;
      }
    }
    bVar11 = true;
  }
  else {
    if (run_on_debug_line_insts) {
      pIVar10 = *(Instruction **)
                 &((_Var1._M_head_impl)->dbg_line_insts_).
                  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  ._M_impl;
      pIVar8 = *(pointer *)((long)&(_Var1._M_head_impl)->dbg_line_insts_ + 8);
      if (pIVar10 != pIVar8) {
        bVar11 = false;
        do {
          local_58._M_head_impl = pIVar10;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
          bVar4 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
          if (!bVar4) {
            if (!bVar11) goto LAB_0021adef;
            break;
          }
          pIVar10 = pIVar10 + 1;
          bVar11 = pIVar10 == pIVar8;
        } while (!bVar11);
      }
    }
    local_58._M_head_impl = _Var1._M_head_impl;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021ae00;
    bVar11 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
    if (bVar11) goto LAB_0021aaf2;
LAB_0021adef:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Function::WhileEachInst(const std::function<bool(Instruction*)>& f,
                             bool run_on_debug_line_insts,
                             bool run_on_non_semantic_insts) {
  if (def_inst_) {
    if (!def_inst_->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (auto& param : params_) {
    if (!param->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (!debug_insts_in_header_.empty()) {
    Instruction* di = &debug_insts_in_header_.front();
    while (di != nullptr) {
      Instruction* next_instruction = di->NextNode();
      if (!di->WhileEachInst(f, run_on_debug_line_insts)) return false;
      di = next_instruction;
    }
  }

  for (auto& bb : blocks_) {
    if (!bb->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (end_inst_) {
    if (!end_inst_->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (run_on_non_semantic_insts) {
    for (auto& non_semantic : non_semantic_) {
      if (!non_semantic->WhileEachInst(f, run_on_debug_line_insts)) {
        return false;
      }
    }
  }

  return true;
}